

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop.cpp
# Opt level: O0

int ncnn::binary_op<ncnn::binary_op_div>(Mat *a,Mat *b,Mat *c,Option *opt)

{
  bool bVar1;
  float *pfVar2;
  float *pfVar3;
  Mat *in_RDX;
  Mat *in_RSI;
  Mat *in_RDI;
  float fVar4;
  int i_14;
  int i_13;
  float b0_7;
  int x_7;
  float a0_7;
  int y_7;
  float *outptr_16;
  float *ptr1_12;
  int i_12;
  float *outptr_15;
  float *ptr1_11;
  float a0_6;
  int q_14;
  int i_11;
  float a0_5;
  int i_10;
  float a0_4;
  int i_9;
  float *outptr_14;
  float *ptr1_10;
  int q_13;
  float a0_3;
  int x_6;
  float b0_6;
  int y_6;
  float *outptr_13;
  float *ptr_12;
  int i_8;
  float b0_5;
  int i_7;
  int x_5;
  float a0_2;
  int y_5;
  float *outptr_12;
  float *ptr1_9;
  float *ptr_11;
  int q_12;
  int i_6;
  float *outptr_11;
  float b0_4;
  float *ptr_10;
  int q_11;
  int i_5;
  float *outptr_10;
  float *ptr_9;
  int q_10;
  float b0_3;
  int x_4;
  float b0_2;
  int y_4;
  float *outptr_9;
  float *ptr1_8;
  float *ptr_8;
  int q_9;
  int i_4;
  float *outptr_8;
  float *ptr1_7;
  float *ptr_7;
  int q_8;
  int x_3;
  int y_3;
  float *outptr_7;
  float *ptr1_6;
  float *ptr_6;
  int q_7;
  int x_2;
  float a0_1;
  int y_2;
  float *outptr_6;
  float *ptr1_5;
  float *ptr_5;
  int q_6;
  int x_1;
  int y_1;
  float *outptr_5;
  float *ptr1_4;
  float *ptr_4;
  int q_5;
  int x;
  float b0_1;
  int y;
  float *outptr_4;
  float *ptr1_3;
  float *ptr_3;
  int q_4;
  int i_3;
  float *outptr_3;
  float *ptr1_2;
  float *ptr_2;
  int q_3;
  int i_2;
  float *outptr_2;
  float *ptr1_1;
  float *a0;
  int q_2;
  int i_1;
  float *outptr_1;
  float *ptr1;
  float *ptr_1;
  int q_1;
  int i;
  float *outptr;
  float *b0;
  float *ptr;
  int q;
  int size1;
  int channels1;
  int h1;
  int w1;
  size_t elemsize;
  int size;
  int channels;
  int h;
  int w;
  binary_op_div op;
  Mat *in_stack_fffffffffffff170;
  undefined4 in_stack_fffffffffffff178;
  undefined4 in_stack_fffffffffffff17c;
  size_t in_stack_fffffffffffff180;
  int _c;
  int _h;
  undefined8 in_stack_fffffffffffff188;
  int _w;
  undefined4 in_stack_fffffffffffff190;
  int in_stack_fffffffffffff194;
  Mat *in_stack_fffffffffffff198;
  int local_d38;
  int local_d34;
  float local_d30;
  int local_d2c;
  float local_d28;
  int local_d24;
  float *local_d20;
  float *local_d18;
  int local_d0c;
  Mat local_d08;
  float *local_cc0;
  Mat local_cb8;
  float *local_c70;
  float local_c64;
  int local_c60;
  int local_c5c;
  float local_c58;
  int local_c54;
  float local_c50;
  int local_c4c;
  Mat local_c48;
  float *local_c00;
  Mat local_bf8;
  Mat *local_bb0;
  int local_ba4;
  float local_ba0;
  int local_b9c;
  float local_b98;
  int local_b94;
  float *local_b90;
  float *local_b88;
  int local_b80;
  float local_b7c;
  int local_b78;
  int local_b74;
  float local_b70;
  int local_b6c;
  Mat local_b68;
  float *local_b20;
  Mat local_b18;
  float *local_ad0;
  float *local_ac8;
  int local_ac0;
  int local_abc;
  Mat local_ab8;
  float *local_a70;
  float local_a64;
  Mat local_a60;
  float *local_a18;
  int local_a10;
  int local_a0c;
  Mat local_a08;
  float *local_9c0;
  Mat local_9b8;
  float *local_970;
  int local_964;
  float local_960;
  int local_95c;
  float local_958;
  int local_954;
  Mat local_950;
  float *local_908;
  float *local_900;
  Mat local_8f8;
  float *local_8b0;
  int local_8a8;
  int local_8a4;
  Mat local_8a0;
  float *local_858;
  Mat local_850;
  float *local_808;
  Mat local_800;
  float *local_7b8;
  int local_7ac;
  int local_7a8;
  int local_7a4;
  Mat local_7a0;
  float *local_758;
  Mat local_750;
  float *local_708;
  Mat local_700;
  float *local_6b8;
  int local_6b0;
  int local_6ac;
  float local_6a8;
  int local_6a4;
  Mat local_6a0;
  float *local_658;
  Mat local_650;
  float *local_608;
  Mat local_600;
  float *local_5b8;
  int local_5ac;
  int local_5a8;
  int local_5a4;
  Mat local_5a0;
  float *local_558;
  Mat local_550;
  float *local_508;
  Mat local_500;
  float *local_4b8;
  int local_4b0;
  int local_4ac;
  float local_4a8;
  int local_4a4;
  Mat local_4a0;
  float *local_458;
  Mat local_450;
  float *local_408;
  Mat local_400;
  float *local_3b8;
  int local_3b0;
  int local_3ac;
  Mat local_3a8;
  float *local_360;
  Mat local_358;
  float *local_310;
  float *local_308;
  int local_300;
  int local_2fc;
  Mat local_2f8;
  float *local_2b0;
  Mat local_2a8;
  float *local_260;
  Mat local_258;
  float *local_210;
  int local_208;
  int local_204;
  Mat local_200;
  float *local_1b8;
  float *local_1b0;
  Mat local_1a8;
  float *local_160;
  int local_158;
  int local_154;
  Mat local_150;
  float *local_108;
  Mat local_100;
  float *local_b8;
  Mat local_b0;
  float *local_68;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  size_t local_48;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  binary_op_div local_29 [9];
  Mat *local_20;
  Mat *local_18;
  Mat *local_10;
  
  local_30 = in_RDI->w;
  local_34 = in_RDI->h;
  local_38 = in_RDI->c;
  local_3c = local_30 * local_34;
  local_48 = in_RDI->elemsize;
  local_4c = in_RSI->w;
  local_50 = in_RSI->h;
  local_54 = in_RSI->c;
  local_58 = local_4c * local_50;
  _c = (int)(in_stack_fffffffffffff180 >> 0x20);
  _h = (int)in_stack_fffffffffffff188;
  _w = (int)((ulong)in_stack_fffffffffffff188 >> 0x20);
  local_18 = in_RSI;
  local_10 = in_RDI;
  if (in_RDI->dims == 3) {
    if (in_RSI->dims == 3) {
      if (((local_4c == 1) && (local_50 == 1)) && (local_54 == local_38)) {
        Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190),_w,_h,_c,
                    CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178),
                    (Allocator *)in_stack_fffffffffffff170);
        bVar1 = Mat::empty(in_stack_fffffffffffff170);
        if (!bVar1) {
          for (local_5c = 0; local_5c < local_38; local_5c = local_5c + 1) {
            Mat::channel(in_stack_fffffffffffff198,in_stack_fffffffffffff194);
            pfVar2 = Mat::operator_cast_to_float_(&local_b0);
            Mat::~Mat((Mat *)0x548fed);
            local_68 = pfVar2;
            Mat::channel(in_stack_fffffffffffff198,in_stack_fffffffffffff194);
            pfVar2 = Mat::operator_cast_to_float_(&local_100);
            Mat::~Mat((Mat *)0x54903b);
            local_b8 = pfVar2;
            Mat::channel(in_stack_fffffffffffff198,in_stack_fffffffffffff194);
            pfVar2 = Mat::operator_cast_to_float_(&local_150);
            Mat::~Mat((Mat *)0x549089);
            local_108 = pfVar2;
            for (local_154 = 0; local_154 < local_3c; local_154 = local_154 + 1) {
              fVar4 = binary_op_div::operator()(local_29,local_68 + local_154,local_b8);
              local_108[local_154] = fVar4;
            }
          }
          return 0;
        }
        return -100;
      }
      if (((local_4c == local_30) && (local_50 == local_34)) && (local_54 == 1)) {
        Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190),_w,_h,_c,
                    CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178),
                    (Allocator *)in_stack_fffffffffffff170);
        bVar1 = Mat::empty(in_stack_fffffffffffff170);
        if (!bVar1) {
          for (local_158 = 0; local_158 < local_38; local_158 = local_158 + 1) {
            Mat::channel(in_stack_fffffffffffff198,in_stack_fffffffffffff194);
            pfVar2 = Mat::operator_cast_to_float_(&local_1a8);
            Mat::~Mat((Mat *)0x54921c);
            local_160 = pfVar2;
            local_1b0 = Mat::operator_cast_to_float_(local_18);
            Mat::channel(in_stack_fffffffffffff198,in_stack_fffffffffffff194);
            pfVar2 = Mat::operator_cast_to_float_(&local_200);
            Mat::~Mat((Mat *)0x54927f);
            local_1b8 = pfVar2;
            for (local_204 = 0; local_204 < local_3c; local_204 = local_204 + 1) {
              fVar4 = binary_op_div::operator()
                                (local_29,local_160 + local_204,local_1b0 + local_204);
              local_1b8[local_204] = fVar4;
            }
          }
          return 0;
        }
        return -100;
      }
      if (((local_30 == 1) && (local_34 == 1)) && (local_54 == local_38)) {
        Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190),_w,_h,_c,
                    CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178),
                    (Allocator *)in_stack_fffffffffffff170);
        bVar1 = Mat::empty(in_stack_fffffffffffff170);
        if (!bVar1) {
          for (local_208 = 0; local_208 < local_54; local_208 = local_208 + 1) {
            Mat::channel(in_stack_fffffffffffff198,in_stack_fffffffffffff194);
            pfVar2 = Mat::operator_cast_to_float_(&local_258);
            Mat::~Mat((Mat *)0x54941b);
            local_210 = pfVar2;
            Mat::channel(in_stack_fffffffffffff198,in_stack_fffffffffffff194);
            pfVar2 = Mat::operator_cast_to_float_(&local_2a8);
            Mat::~Mat((Mat *)0x549469);
            local_260 = pfVar2;
            Mat::channel(in_stack_fffffffffffff198,in_stack_fffffffffffff194);
            pfVar2 = Mat::operator_cast_to_float_(&local_2f8);
            Mat::~Mat((Mat *)0x5494b7);
            local_2b0 = pfVar2;
            for (local_2fc = 0; local_2fc < local_58; local_2fc = local_2fc + 1) {
              fVar4 = binary_op_div::operator()(local_29,local_210,local_260 + local_2fc);
              local_2b0[local_2fc] = fVar4;
            }
          }
          return 0;
        }
        return -100;
      }
      if (((local_4c == local_30) && (local_50 == local_34)) && (local_38 == 1)) {
        Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190),_w,_h,_c,
                    CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178),
                    (Allocator *)in_stack_fffffffffffff170);
        bVar1 = Mat::empty(in_stack_fffffffffffff170);
        if (!bVar1) {
          for (local_300 = 0; local_300 < local_54; local_300 = local_300 + 1) {
            local_308 = Mat::operator_cast_to_float_(local_10);
            Mat::channel(in_stack_fffffffffffff198,in_stack_fffffffffffff194);
            pfVar2 = Mat::operator_cast_to_float_(&local_358);
            Mat::~Mat((Mat *)0x54965f);
            local_310 = pfVar2;
            Mat::channel(in_stack_fffffffffffff198,in_stack_fffffffffffff194);
            pfVar2 = Mat::operator_cast_to_float_(&local_3a8);
            Mat::~Mat((Mat *)0x5496ad);
            local_360 = pfVar2;
            for (local_3ac = 0; local_3ac < local_58; local_3ac = local_3ac + 1) {
              fVar4 = binary_op_div::operator()
                                (local_29,local_308 + local_3ac,local_310 + local_3ac);
              local_360[local_3ac] = fVar4;
            }
          }
          return 0;
        }
        return -100;
      }
      if (((local_30 != 1) && (local_4c == 1)) && ((local_50 == local_34 && (local_54 == local_38)))
         ) {
        Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190),_w,_h,_c,
                    CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178),
                    (Allocator *)in_stack_fffffffffffff170);
        bVar1 = Mat::empty(in_stack_fffffffffffff170);
        if (!bVar1) {
          for (local_3b0 = 0; local_3b0 < local_54; local_3b0 = local_3b0 + 1) {
            Mat::channel(in_stack_fffffffffffff198,in_stack_fffffffffffff194);
            pfVar2 = Mat::operator_cast_to_float_(&local_400);
            Mat::~Mat((Mat *)0x54985d);
            local_3b8 = pfVar2;
            Mat::channel(in_stack_fffffffffffff198,in_stack_fffffffffffff194);
            pfVar2 = Mat::operator_cast_to_float_(&local_450);
            Mat::~Mat((Mat *)0x5498ab);
            local_408 = pfVar2;
            Mat::channel(in_stack_fffffffffffff198,in_stack_fffffffffffff194);
            pfVar2 = Mat::operator_cast_to_float_(&local_4a0);
            Mat::~Mat((Mat *)0x5498f9);
            local_458 = pfVar2;
            for (local_4a4 = 0; local_4a4 < local_34; local_4a4 = local_4a4 + 1) {
              local_4a8 = local_408[local_4a4];
              for (local_4ac = 0; local_4ac < local_30; local_4ac = local_4ac + 1) {
                fVar4 = binary_op_div::operator()(local_29,local_3b8 + local_4ac,&local_4a8);
                local_458[local_4ac] = fVar4;
              }
              local_3b8 = local_3b8 + local_30;
              local_458 = local_458 + local_30;
            }
          }
          return 0;
        }
        return -100;
      }
      if ((((local_4c == local_30) && (local_34 != 1)) && (local_50 == 1)) && (local_54 == local_38)
         ) {
        Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190),_w,_h,_c,
                    CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178),
                    (Allocator *)in_stack_fffffffffffff170);
        bVar1 = Mat::empty(in_stack_fffffffffffff170);
        if (!bVar1) {
          for (local_4b0 = 0; local_4b0 < local_54; local_4b0 = local_4b0 + 1) {
            Mat::channel(in_stack_fffffffffffff198,in_stack_fffffffffffff194);
            pfVar2 = Mat::operator_cast_to_float_(&local_500);
            Mat::~Mat((Mat *)0x549b2f);
            local_4b8 = pfVar2;
            Mat::channel(in_stack_fffffffffffff198,in_stack_fffffffffffff194);
            pfVar2 = Mat::operator_cast_to_float_(&local_550);
            Mat::~Mat((Mat *)0x549b7d);
            local_508 = pfVar2;
            Mat::channel(in_stack_fffffffffffff198,in_stack_fffffffffffff194);
            pfVar2 = Mat::operator_cast_to_float_(&local_5a0);
            Mat::~Mat((Mat *)0x549bcb);
            local_558 = pfVar2;
            for (local_5a4 = 0; local_5a4 < local_34; local_5a4 = local_5a4 + 1) {
              for (local_5a8 = 0; local_5a8 < local_30; local_5a8 = local_5a8 + 1) {
                fVar4 = binary_op_div::operator()
                                  (local_29,local_4b8 + local_5a8,local_508 + local_5a8);
                local_558[local_5a8] = fVar4;
              }
              local_4b8 = local_4b8 + local_30;
              local_558 = local_558 + local_30;
            }
          }
          return 0;
        }
        return -100;
      }
      if ((((local_4c != 1) && (local_30 == 1)) && (local_50 == local_34)) && (local_54 == local_38)
         ) {
        Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190),_w,_h,_c,
                    CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178),
                    (Allocator *)in_stack_fffffffffffff170);
        bVar1 = Mat::empty(in_stack_fffffffffffff170);
        if (!bVar1) {
          for (local_5ac = 0; local_5ac < local_54; local_5ac = local_5ac + 1) {
            Mat::channel(in_stack_fffffffffffff198,in_stack_fffffffffffff194);
            pfVar2 = Mat::operator_cast_to_float_(&local_600);
            Mat::~Mat((Mat *)0x549df2);
            local_5b8 = pfVar2;
            Mat::channel(in_stack_fffffffffffff198,in_stack_fffffffffffff194);
            pfVar2 = Mat::operator_cast_to_float_(&local_650);
            Mat::~Mat((Mat *)0x549e40);
            local_608 = pfVar2;
            Mat::channel(in_stack_fffffffffffff198,in_stack_fffffffffffff194);
            pfVar2 = Mat::operator_cast_to_float_(&local_6a0);
            Mat::~Mat((Mat *)0x549e8e);
            local_658 = pfVar2;
            for (local_6a4 = 0; local_6a4 < local_50; local_6a4 = local_6a4 + 1) {
              local_6a8 = local_5b8[local_6a4];
              for (local_6ac = 0; local_6ac < local_4c; local_6ac = local_6ac + 1) {
                fVar4 = binary_op_div::operator()(local_29,&local_6a8,local_608 + local_6ac);
                local_658[local_6ac] = fVar4;
              }
              local_608 = local_608 + local_4c;
              local_658 = local_658 + local_4c;
            }
          }
          return 0;
        }
        return -100;
      }
      if (((local_4c == local_30) && (local_50 != 1)) && ((local_34 == 1 && (local_54 == local_38)))
         ) {
        Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190),_w,_h,_c,
                    CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178),
                    (Allocator *)in_stack_fffffffffffff170);
        bVar1 = Mat::empty(in_stack_fffffffffffff170);
        if (!bVar1) {
          for (local_6b0 = 0; local_6b0 < local_54; local_6b0 = local_6b0 + 1) {
            Mat::channel(in_stack_fffffffffffff198,in_stack_fffffffffffff194);
            pfVar2 = Mat::operator_cast_to_float_(&local_700);
            Mat::~Mat((Mat *)0x54a0c4);
            local_6b8 = pfVar2;
            Mat::channel(in_stack_fffffffffffff198,in_stack_fffffffffffff194);
            pfVar2 = Mat::operator_cast_to_float_(&local_750);
            Mat::~Mat((Mat *)0x54a112);
            local_708 = pfVar2;
            Mat::channel(in_stack_fffffffffffff198,in_stack_fffffffffffff194);
            pfVar2 = Mat::operator_cast_to_float_(&local_7a0);
            Mat::~Mat((Mat *)0x54a160);
            local_758 = pfVar2;
            for (local_7a4 = 0; local_7a4 < local_50; local_7a4 = local_7a4 + 1) {
              for (local_7a8 = 0; local_7a8 < local_4c; local_7a8 = local_7a8 + 1) {
                fVar4 = binary_op_div::operator()
                                  (local_29,local_6b8 + local_7a8,local_708 + local_7a8);
                local_758[local_7a8] = fVar4;
              }
              local_708 = local_708 + local_4c;
              local_758 = local_758 + local_4c;
            }
          }
          return 0;
        }
        return -100;
      }
      Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190),_w,_h,_c,
                  CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178),
                  (Allocator *)in_stack_fffffffffffff170);
      bVar1 = Mat::empty(in_stack_fffffffffffff170);
      if (!bVar1) {
        for (local_7ac = 0; local_7ac < local_38; local_7ac = local_7ac + 1) {
          Mat::channel(in_stack_fffffffffffff198,in_stack_fffffffffffff194);
          pfVar2 = Mat::operator_cast_to_float_(&local_800);
          Mat::~Mat((Mat *)0x54a343);
          local_7b8 = pfVar2;
          Mat::channel(in_stack_fffffffffffff198,in_stack_fffffffffffff194);
          pfVar2 = Mat::operator_cast_to_float_(&local_850);
          Mat::~Mat((Mat *)0x54a391);
          local_808 = pfVar2;
          Mat::channel(in_stack_fffffffffffff198,in_stack_fffffffffffff194);
          pfVar2 = Mat::operator_cast_to_float_(&local_8a0);
          Mat::~Mat((Mat *)0x54a3df);
          local_858 = pfVar2;
          for (local_8a4 = 0; local_8a4 < local_3c; local_8a4 = local_8a4 + 1) {
            fVar4 = binary_op_div::operator()(local_29,local_7b8 + local_8a4,local_808 + local_8a4);
            local_858[local_8a4] = fVar4;
          }
        }
        return 0;
      }
      return -100;
    }
    Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190),_w,_h,_c,
                CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178),
                (Allocator *)in_stack_fffffffffffff170);
    bVar1 = Mat::empty(in_stack_fffffffffffff170);
    if (bVar1) {
      return -100;
    }
    if (local_18->dims == 2) {
      for (local_8a8 = 0; local_8a8 < local_38; local_8a8 = local_8a8 + 1) {
        Mat::channel(in_stack_fffffffffffff198,in_stack_fffffffffffff194);
        pfVar2 = Mat::operator_cast_to_float_(&local_8f8);
        Mat::~Mat((Mat *)0x54a55d);
        local_8b0 = pfVar2;
        local_900 = Mat::row(local_18,local_8a8);
        Mat::channel(in_stack_fffffffffffff198,in_stack_fffffffffffff194);
        pfVar2 = Mat::operator_cast_to_float_(&local_950);
        Mat::~Mat((Mat *)0x54a5c7);
        local_908 = pfVar2;
        for (local_954 = 0; local_954 < local_34; local_954 = local_954 + 1) {
          local_958 = local_900[local_954];
          for (local_95c = 0; local_95c < local_30; local_95c = local_95c + 1) {
            fVar4 = binary_op_div::operator()(local_29,local_8b0 + local_95c,&local_958);
            local_908[local_95c] = fVar4;
          }
          local_8b0 = local_8b0 + local_30;
          local_908 = local_908 + local_30;
        }
      }
      return 0;
    }
    if (local_18->dims == 1) {
      if (local_18->w == 1) {
        pfVar2 = Mat::operator[](local_18,0);
        local_960 = *pfVar2;
        for (local_964 = 0; local_964 < local_38; local_964 = local_964 + 1) {
          Mat::channel(in_stack_fffffffffffff198,in_stack_fffffffffffff194);
          pfVar2 = Mat::operator_cast_to_float_(&local_9b8);
          Mat::~Mat((Mat *)0x54a79f);
          local_970 = pfVar2;
          Mat::channel(in_stack_fffffffffffff198,in_stack_fffffffffffff194);
          pfVar2 = Mat::operator_cast_to_float_(&local_a08);
          Mat::~Mat((Mat *)0x54a7ea);
          local_9c0 = pfVar2;
          for (local_a0c = 0; local_a0c < local_3c; local_a0c = local_a0c + 1) {
            fVar4 = binary_op_div::operator()(local_29,local_970 + local_a0c,&local_960);
            local_9c0[local_a0c] = fVar4;
          }
        }
        return 0;
      }
      for (local_a10 = 0; local_a10 < local_38; local_a10 = local_a10 + 1) {
        Mat::channel(in_stack_fffffffffffff198,in_stack_fffffffffffff194);
        pfVar2 = Mat::operator_cast_to_float_(&local_a60);
        Mat::~Mat((Mat *)0x54a8eb);
        local_a18 = pfVar2;
        pfVar2 = Mat::operator[](local_18,(long)local_a10);
        local_a64 = *pfVar2;
        Mat::channel(in_stack_fffffffffffff198,in_stack_fffffffffffff194);
        pfVar2 = Mat::operator_cast_to_float_(&local_ab8);
        Mat::~Mat((Mat *)0x54a955);
        local_a70 = pfVar2;
        for (local_abc = 0; local_abc < local_3c; local_abc = local_abc + 1) {
          fVar4 = binary_op_div::operator()(local_29,local_a18 + local_abc,&local_a64);
          local_a70[local_abc] = fVar4;
        }
      }
      return 0;
    }
  }
  else {
    local_20 = in_RDX;
    if (in_RDI->dims == 2) {
      if (in_RSI->dims == 3) {
        Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190),_w,_h,_c,
                    CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178),
                    (Allocator *)in_stack_fffffffffffff170);
        bVar1 = Mat::empty(in_stack_fffffffffffff170);
        if (!bVar1) {
          for (local_ac0 = 0; local_ac0 < local_54; local_ac0 = local_ac0 + 1) {
            local_ac8 = Mat::row(local_10,local_ac0);
            Mat::channel(in_stack_fffffffffffff198,in_stack_fffffffffffff194);
            pfVar2 = Mat::operator_cast_to_float_(&local_b18);
            Mat::~Mat((Mat *)0x54aaf1);
            local_ad0 = pfVar2;
            Mat::channel(in_stack_fffffffffffff198,in_stack_fffffffffffff194);
            pfVar2 = Mat::operator_cast_to_float_(&local_b68);
            Mat::~Mat((Mat *)0x54ab39);
            local_b20 = pfVar2;
            for (local_b6c = 0; local_b6c < local_50; local_b6c = local_b6c + 1) {
              local_b70 = local_ac8[local_b6c];
              for (local_b74 = 0; local_b74 < local_4c; local_b74 = local_b74 + 1) {
                fVar4 = binary_op_div::operator()(local_29,&local_b70,local_ad0 + local_b74);
                local_b20[local_b74] = fVar4;
              }
              local_ad0 = local_ad0 + local_4c;
              local_b20 = local_b20 + local_4c;
            }
          }
          return 0;
        }
        return -100;
      }
      Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190),_w,_h,
                  in_stack_fffffffffffff180,
                  (Allocator *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
      bVar1 = Mat::empty(in_stack_fffffffffffff170);
      if (bVar1) {
        return -100;
      }
      if (local_18->dims == 2) {
        for (local_b78 = 0; local_b78 < local_3c; local_b78 = local_b78 + 1) {
          pfVar2 = Mat::operator[](local_10,(long)local_b78);
          pfVar3 = Mat::operator[](local_18,(long)local_b78);
          fVar4 = binary_op_div::operator()(local_29,pfVar2,pfVar3);
          pfVar2 = Mat::operator[](local_20,(long)local_b78);
          *pfVar2 = fVar4;
        }
        return 0;
      }
      if (local_18->dims == 1) {
        Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190),
                    (int)((ulong)in_stack_fffffffffffff188 >> 0x20),(int)in_stack_fffffffffffff188,
                    in_stack_fffffffffffff180,
                    (Allocator *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
        bVar1 = Mat::empty(in_stack_fffffffffffff170);
        if (bVar1) {
          return -100;
        }
        if (local_18->w == 1) {
          pfVar2 = Mat::operator[](local_18,0);
          local_b7c = *pfVar2;
          for (local_b80 = 0; local_b80 < local_3c; local_b80 = local_b80 + 1) {
            pfVar2 = Mat::operator[](local_10,(long)local_b80);
            fVar4 = binary_op_div::operator()(local_29,pfVar2,&local_b7c);
            pfVar2 = Mat::operator[](local_20,(long)local_b80);
            *pfVar2 = fVar4;
          }
          return 0;
        }
        local_b88 = Mat::operator_cast_to_float_(local_10);
        local_b90 = Mat::operator_cast_to_float_(local_20);
        for (local_b94 = 0; local_b94 < local_34; local_b94 = local_b94 + 1) {
          pfVar2 = Mat::operator[](local_18,(long)local_b94);
          local_b98 = *pfVar2;
          for (local_b9c = 0; local_b9c < local_30; local_b9c = local_b9c + 1) {
            fVar4 = binary_op_div::operator()(local_29,local_b88 + local_b9c,&local_b98);
            local_b90[local_b9c] = fVar4;
          }
          local_b88 = local_b88 + local_30;
          local_b90 = local_b90 + local_30;
        }
        return 0;
      }
    }
    else if (in_RDI->dims == 1) {
      if (in_RDI->w == 1) {
        if (in_RSI->dims == 3) {
          Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190),_w,_h,_c,
                      CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178),
                      (Allocator *)in_stack_fffffffffffff170);
          bVar1 = Mat::empty(in_stack_fffffffffffff170);
          if (!bVar1) {
            pfVar2 = Mat::operator[](local_10,0);
            local_ba0 = *pfVar2;
            for (local_ba4 = 0; local_ba4 < local_54; local_ba4 = local_ba4 + 1) {
              Mat::channel(in_stack_fffffffffffff198,in_stack_fffffffffffff194);
              in_stack_fffffffffffff198 = (Mat *)Mat::operator_cast_to_float_(&local_bf8);
              Mat::~Mat((Mat *)0x54b0f2);
              local_bb0 = in_stack_fffffffffffff198;
              Mat::channel(in_stack_fffffffffffff198,in_stack_fffffffffffff194);
              pfVar2 = Mat::operator_cast_to_float_(&local_c48);
              Mat::~Mat((Mat *)0x54b13a);
              local_c00 = pfVar2;
              for (local_c4c = 0; local_c4c < local_58; local_c4c = local_c4c + 1) {
                fVar4 = binary_op_div::operator()
                                  (local_29,&local_ba0,
                                   (float *)((long)&local_bb0->data + (long)local_c4c * 4));
                local_c00[local_c4c] = fVar4;
              }
            }
            return 0;
          }
          return -100;
        }
        if (in_RSI->dims == 2) {
          Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190),_w,_h,
                      in_stack_fffffffffffff180,
                      (Allocator *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
          bVar1 = Mat::empty(in_stack_fffffffffffff170);
          if (!bVar1) {
            pfVar2 = Mat::operator[](local_10,0);
            local_c50 = *pfVar2;
            for (local_c54 = 0; local_c54 < local_58; local_c54 = local_c54 + 1) {
              pfVar2 = Mat::operator[](local_18,(long)local_c54);
              fVar4 = binary_op_div::operator()(local_29,&local_c50,pfVar2);
              pfVar2 = Mat::operator[](local_20,(long)local_c54);
              *pfVar2 = fVar4;
            }
            return 0;
          }
          return -100;
        }
        if (in_RSI->dims == 1) {
          Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190),_w,
                      in_stack_fffffffffffff180,
                      (Allocator *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
          bVar1 = Mat::empty(in_stack_fffffffffffff170);
          if (!bVar1) {
            pfVar2 = Mat::operator[](local_10,0);
            local_c58 = *pfVar2;
            for (local_c5c = 0; local_c5c < local_4c; local_c5c = local_c5c + 1) {
              pfVar2 = Mat::operator[](local_18,(long)local_c5c);
              fVar4 = binary_op_div::operator()(local_29,&local_c58,pfVar2);
              pfVar2 = Mat::operator[](local_20,(long)local_c5c);
              *pfVar2 = fVar4;
            }
            return 0;
          }
          return -100;
        }
      }
      if (in_RSI->dims == 3) {
        Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190),_w,_h,_c,
                    CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178),
                    (Allocator *)in_stack_fffffffffffff170);
        bVar1 = Mat::empty(in_stack_fffffffffffff170);
        if (!bVar1) {
          for (local_c60 = 0; local_c60 < local_54; local_c60 = local_c60 + 1) {
            pfVar2 = Mat::operator[](local_10,(long)local_c60);
            local_c64 = *pfVar2;
            Mat::channel(in_stack_fffffffffffff198,in_stack_fffffffffffff194);
            pfVar2 = Mat::operator_cast_to_float_(&local_cb8);
            Mat::~Mat((Mat *)0x54b4e4);
            local_c70 = pfVar2;
            Mat::channel(in_stack_fffffffffffff198,in_stack_fffffffffffff194);
            pfVar2 = Mat::operator_cast_to_float_(&local_d08);
            Mat::~Mat((Mat *)0x54b52c);
            local_cc0 = pfVar2;
            for (local_d0c = 0; local_d0c < local_58; local_d0c = local_d0c + 1) {
              fVar4 = binary_op_div::operator()(local_29,&local_c64,local_c70 + local_d0c);
              local_cc0[local_d0c] = fVar4;
            }
          }
          return 0;
        }
        return -100;
      }
      if (in_RSI->dims == 2) {
        Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190),_w,_h,
                    in_stack_fffffffffffff180,
                    (Allocator *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
        bVar1 = Mat::empty(in_stack_fffffffffffff170);
        if (!bVar1) {
          local_d18 = Mat::operator_cast_to_float_(local_18);
          local_d20 = Mat::operator_cast_to_float_(local_20);
          for (local_d24 = 0; local_d24 < local_50; local_d24 = local_d24 + 1) {
            pfVar2 = Mat::operator[](local_10,(long)local_d24);
            local_d28 = *pfVar2;
            for (local_d2c = 0; local_d2c < local_4c; local_d2c = local_d2c + 1) {
              fVar4 = binary_op_div::operator()(local_29,&local_d28,local_d18 + local_d2c);
              local_d20[local_d2c] = fVar4;
            }
            local_d18 = local_d18 + local_4c;
            local_d20 = local_d20 + local_4c;
          }
          return 0;
        }
        return -100;
      }
      if (in_RSI->dims == 1) {
        Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190),_w,
                    in_stack_fffffffffffff180,
                    (Allocator *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
        bVar1 = Mat::empty(in_stack_fffffffffffff170);
        if (bVar1) {
          return -100;
        }
        if (local_18->w == 1) {
          pfVar2 = Mat::operator[](local_18,0);
          local_d30 = *pfVar2;
          for (local_d34 = 0; local_d34 < local_30; local_d34 = local_d34 + 1) {
            pfVar2 = Mat::operator[](local_10,(long)local_d34);
            fVar4 = binary_op_div::operator()(local_29,pfVar2,&local_d30);
            pfVar2 = Mat::operator[](local_20,(long)local_d34);
            *pfVar2 = fVar4;
          }
          return 0;
        }
        for (local_d38 = 0; local_d38 < local_30; local_d38 = local_d38 + 1) {
          pfVar2 = Mat::operator[](local_10,(long)local_d38);
          pfVar3 = Mat::operator[](local_18,(long)local_d38);
          fVar4 = binary_op_div::operator()(local_29,pfVar2,pfVar3);
          pfVar2 = Mat::operator[](local_20,(long)local_d38);
          *pfVar2 = fVar4;
        }
      }
    }
  }
  return 0;
}

Assistant:

static int binary_op(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int channels = a.c;
    int size = w * h;
    size_t elemsize = a.elemsize;

    int w1 = b.w;
    int h1 = b.h;
    int channels1 = b.c;
    int size1 = w1 * h1;

    if (a.dims == 3)
    {
        if (b.dims == 3)
        {
            if (w1 == 1 && h1 == 1 && channels1 == channels)
            {
                // special type 1
                c.create(w, h, channels, elemsize, opt.blob_allocator);
                if (c.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = a.channel(q);
                    const float* b0 = b.channel(q);
                    float* outptr = c.channel(q);
                    for (int i = 0; i < size; i++)
                    {
                        outptr[i] = op(ptr[i], b0[0]);
                    }
                }

                return 0;
            }

            if (w1 == w && h1 == h && channels1 == 1)
            {
                // special type 2
                c.create(w, h, channels, elemsize, opt.blob_allocator);
                if (c.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = a.channel(q);
                    const float* ptr1 = b;
                    float* outptr = c.channel(q);
                    for (int i = 0; i < size; i++)
                    {
                        outptr[i] = op(ptr[i], ptr1[i]);
                    }
                }

                return 0;
            }

            if (w == 1 && h == 1 && channels1 == channels)
            {
                // special type 3
                c.create(w1, h1, channels1, elemsize, opt.blob_allocator);
                if (c.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels1; q++)
                {
                    const float* a0 = a.channel(q);
                    const float* ptr1 = b.channel(q);
                    float* outptr = c.channel(q);
                    for (int i = 0; i < size1; i++)
                    {
                        outptr[i] = op(a0[0], ptr1[i]);
                    }
                }

                return 0;
            }

            if (w1 == w && h1 == h && channels == 1)
            {
                // special type 4
                c.create(w1, h1, channels1, elemsize, opt.blob_allocator);
                if (c.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels1; q++)
                {
                    const float* ptr = a;
                    const float* ptr1 = b.channel(q);
                    float* outptr = c.channel(q);
                    for (int i = 0; i < size1; i++)
                    {
                        outptr[i] = op(ptr[i], ptr1[i]);
                    }
                }

                return 0;
            }

            if (w != 1 && w1 == 1 && h1 == h && channels1 == channels)
            {
                // special type 5
                c.create(w, h, channels, elemsize, opt.blob_allocator);
                if (c.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels1; q++)
                {
                    const float* ptr = a.channel(q);
                    const float* ptr1 = b.channel(q);
                    float* outptr = c.channel(q);

                    for (int y = 0; y < h; y++)
                    {
                        const float b0 = ptr1[y];
                        for (int x = 0; x < w; x++)
                        {
                            outptr[x] = op(ptr[x], b0);
                        }

                        ptr += w;
                        outptr += w;
                    }
                }

                return 0;
            }

            if (w1 == w && h != 1 && h1 == 1 && channels1 == channels)
            {
                // special type 6
                c.create(w, h, channels, elemsize, opt.blob_allocator);
                if (c.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels1; q++)
                {
                    const float* ptr = a.channel(q);
                    const float* ptr1 = b.channel(q);
                    float* outptr = c.channel(q);

                    for (int y = 0; y < h; y++)
                    {
                        for (int x = 0; x < w; x++)
                        {
                            outptr[x] = op(ptr[x], ptr1[x]);
                        }

                        ptr += w;
                        outptr += w;
                    }
                }

                return 0;
            }

            if (w1 != 1 && w == 1 && h1 == h && channels1 == channels)
            {
                // special type 7
                c.create(w1, h1, channels1, elemsize, opt.blob_allocator);
                if (c.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels1; q++)
                {
                    const float* ptr = a.channel(q);
                    const float* ptr1 = b.channel(q);
                    float* outptr = c.channel(q);

                    for (int y = 0; y < h1; y++)
                    {
                        const float a0 = ptr[y];
                        for (int x = 0; x < w1; x++)
                        {
                            outptr[x] = op(a0, ptr1[x]);
                        }

                        ptr1 += w1;
                        outptr += w1;
                    }
                }

                return 0;
            }

            if (w1 == w && h1 != 1 && h == 1 && channels1 == channels)
            {
                // special type 8
                c.create(w1, h1, channels1, elemsize, opt.blob_allocator);
                if (c.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels1; q++)
                {
                    const float* ptr = a.channel(q);
                    const float* ptr1 = b.channel(q);
                    float* outptr = c.channel(q);

                    for (int y = 0; y < h1; y++)
                    {
                        for (int x = 0; x < w1; x++)
                        {
                            outptr[x] = op(ptr[x], ptr1[x]);
                        }

                        ptr1 += w1;
                        outptr += w1;
                    }
                }

                return 0;
            }

            // type 19
            c.create(w, h, channels, elemsize, opt.blob_allocator);
            if (c.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);
                const float* ptr1 = b.channel(q);
                float* outptr = c.channel(q);

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = op(ptr[i], ptr1[i]);
                }
            }

            return 0;
        }

        c.create(w, h, channels, elemsize, opt.blob_allocator);
        if (c.empty())
            return -100;

        if (b.dims == 2)
        {
            // type 18
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);
                const float* ptr1 = b.row(q);
                float* outptr = c.channel(q);

                for (int y = 0; y < h; y++)
                {
                    const float b0 = ptr1[y];
                    for (int x = 0; x < w; x++)
                    {
                        outptr[x] = op(ptr[x], b0);
                    }

                    ptr += w;
                    outptr += w;
                }
            }

            return 0;
        }

        if (b.dims == 1)
        {
            if (b.w == 1)
            {
                // type 16
                const float b0 = b[0];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = a.channel(q);
                    float* outptr = c.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        outptr[i] = op(ptr[i], b0);
                    }
                }

                return 0;
            }

            // type 17
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);
                const float b0 = b[q];
                float* outptr = c.channel(q);

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = op(ptr[i], b0);
                }
            }

            return 0;
        }
    }
    else if (a.dims == 2)
    {
        if (b.dims == 3)
        {
            // type 14
            c.create(w1, h1, channels1, elemsize, opt.blob_allocator);
            if (c.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels1; q++)
            {
                const float* ptr = a.row(q);
                const float* ptr1 = b.channel(q);
                float* outptr = c.channel(q);

                for (int y = 0; y < h1; y++)
                {
                    const float a0 = ptr[y];
                    for (int x = 0; x < w1; x++)
                    {
                        outptr[x] = op(a0, ptr1[x]);
                    }

                    ptr1 += w1;
                    outptr += w1;
                }
            }

            return 0;
        }

        c.create(w, h, elemsize, opt.blob_allocator);
        if (c.empty())
            return -100;

        if (b.dims == 2)
        {
            // type 13
            for (int i = 0; i < size; i++)
            {
                c[i] = op(a[i], b[i]);
            }

            return 0;
        }

        if (b.dims == 1)
        {
            c.create(w, h, elemsize, opt.blob_allocator);
            if (c.empty())
                return -100;

            if (b.w == 1)
            {
                // type 11
                const float b0 = b[0];
                for (int i = 0; i < size; i++)
                {
                    c[i] = op(a[i], b0);
                }

                return 0;
            }

            // type 12
            const float* ptr = a;
            float* outptr = c;

            for (int y = 0; y < h; y++)
            {
                const float b0 = b[y];
                for (int x = 0; x < w; x++)
                {
                    outptr[x] = op(ptr[x], b0);
                }

                ptr += w;
                outptr += w;
            }

            return 0;
        }
    }
    else if (a.dims == 1)
    {
        if (a.w == 1)
        {
            if (b.dims == 3)
            {
                // type 4
                c.create(w1, h1, channels1, elemsize, opt.blob_allocator);
                if (c.empty())
                    return -100;

                const float a0 = a[0];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels1; q++)
                {
                    const float* ptr1 = b.channel(q);
                    float* outptr = c.channel(q);

                    for (int i = 0; i < size1; i++)
                    {
                        outptr[i] = op(a0, ptr1[i]);
                    }
                }

                return 0;
            }

            if (b.dims == 2)
            {
                // type 3
                c.create(w1, h1, elemsize, opt.blob_allocator);
                if (c.empty())
                    return -100;

                const float a0 = a[0];
                for (int i = 0; i < size1; i++)
                {
                    c[i] = op(a0, b[i]);
                }

                return 0;
            }

            if (b.dims == 1)
            {
                // type 2
                c.create(w1, elemsize, opt.blob_allocator);
                if (c.empty())
                    return -100;

                const float a0 = a[0];
                for (int i = 0; i < w1; i++)
                {
                    c[i] = op(a0, b[i]);
                }

                return 0;
            }
        }

        if (b.dims == 3)
        {
            // type 9
            c.create(w1, h1, channels1, elemsize, opt.blob_allocator);
            if (c.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels1; q++)
            {
                const float a0 = a[q];
                const float* ptr1 = b.channel(q);
                float* outptr = c.channel(q);

                for (int i = 0; i < size1; i++)
                {
                    outptr[i] = op(a0, ptr1[i]);
                }
            }

            return 0;
        }

        if (b.dims == 2)
        {
            // type 8
            c.create(w1, h1, elemsize, opt.blob_allocator);
            if (c.empty())
                return -100;

            const float* ptr1 = b;
            float* outptr = c;

            for (int y = 0; y < h1; y++)
            {
                const float a0 = a[y];
                for (int x = 0; x < w1; x++)
                {
                    outptr[x] = op(a0, ptr1[x]);
                }

                ptr1 += w1;
                outptr += w1;
            }

            return 0;
        }

        if (b.dims == 1)
        {
            c.create(w, elemsize, opt.blob_allocator);
            if (c.empty())
                return -100;

            if (b.w == 1)
            {
                // type 6
                const float b0 = b[0];
                for (int i = 0; i < w; i++)
                {
                    c[i] = op(a[i], b0);
                }

                return 0;
            }

            // type 7
            for (int i = 0; i < w; i++)
            {
                c[i] = op(a[i], b[i]);
            }
        }
    }

    return 0;
}